

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FLevelStatistics,_FLevelStatistics>::DoCopy
          (TArray<FLevelStatistics,_FLevelStatistics> *this,
          TArray<FLevelStatistics,_FLevelStatistics> *other)

{
  uint uVar1;
  FLevelStatistics *pFVar2;
  uint local_1c;
  uint i;
  TArray<FLevelStatistics,_FLevelStatistics> *other_local;
  TArray<FLevelStatistics,_FLevelStatistics> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (FLevelStatistics *)0x0;
  }
  else {
    pFVar2 = (FLevelStatistics *)
             M_Malloc_Dbg((ulong)this->Most * 0x34,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      memcpy(this->Array + local_1c,other->Array + local_1c,0x34);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}